

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O0

listen_endpoint_t * __thiscall
libtorrent::aux::listen_endpoint_t::operator=(listen_endpoint_t *this,listen_endpoint_t *param_1)

{
  listen_socket_flags_t lVar1;
  listen_endpoint_t *param_1_local;
  listen_endpoint_t *this_local;
  
  boost::asio::ip::address::operator=(&this->addr,&param_1->addr);
  boost::asio::ip::address::operator=(&this->netmask,&param_1->netmask);
  this->port = param_1->port;
  ::std::__cxx11::string::operator=((string *)&this->device,(string *)&param_1->device);
  lVar1.m_val = (param_1->flags).m_val;
  this->ssl = param_1->ssl;
  this->flags = (listen_socket_flags_t)lVar1.m_val;
  return this;
}

Assistant:

struct TORRENT_EXTRA_EXPORT listen_endpoint_t
		{
			listen_endpoint_t(address const& adr, int p, std::string dev, transport s
				, listen_socket_flags_t f, address const& nmask = address{})
				: addr(adr), netmask(nmask), port(p), device(std::move(dev)), ssl(s), flags(f) {}

			bool operator==(listen_endpoint_t const& o) const
			{
				return addr == o.addr
					&& port == o.port
					&& device == o.device
					&& ssl == o.ssl
					&& flags == o.flags;
			}

			address addr;
			// if this listen endpoint/interface doesn't have a gateway, we cannot
			// route outside of our network, this netmask defines the range of our
			// local network
			address netmask;
			int port;
			std::string device;
			transport ssl;
			listen_socket_flags_t flags;
		}